

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void measureAllocationSize(sqlite3 *db,void *p)

{
  int iVar1;
  
  iVar1 = sqlite3DbMallocSize(db,p);
  *db->pnBytesFreed = *db->pnBytesFreed + iVar1;
  return;
}

Assistant:

static SQLITE_NOINLINE void measureAllocationSize(sqlite3 *db, void *p){
  *db->pnBytesFreed += sqlite3DbMallocSize(db,p);
}